

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

int __thiscall CTcPrsGramNodeOr::advance_expansion(CTcPrsGramNodeOr *this)

{
  CTcPrsGramNode *pCVar1;
  bool bVar2;
  
  pCVar1 = this->cur_alt_->next_;
  this->cur_alt_ = pCVar1;
  bVar2 = pCVar1 == (CTcPrsGramNode *)0x0;
  if (bVar2) {
    pCVar1 = (this->super_CTcPrsGramNodeWithChildren).sub_head_;
    this->cur_alt_ = pCVar1;
  }
  (*(pCVar1->super_CTcTokenSource)._vptr_CTcTokenSource[8])();
  return (uint)bVar2;
}

Assistant:

virtual int advance_expansion()
    {
        /* advance to the next state */
        cur_alt_ = cur_alt_->next_;

        /* 
         *   if that was the last state, wrap back to the first state and
         *   indicate a 'carry'; otherwise, indicate no carry 
         */
        if (cur_alt_ == 0)
        {
            /* we ran out of states - wrap back to the first one */
            cur_alt_ = sub_head_;

            /* initialize expansion in the new subitem */
            cur_alt_->init_expansion();

            /* indicate that we've wrapped and should carry forward */
            return TRUE;
        }
        else
        {
            /* initialize expansion in the new subitem */
            cur_alt_->init_expansion();

            /* this is another valid state - no carry */
            return FALSE;
        }
    }